

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_effect_expr(parser *p)

{
  int16_t iVar1;
  int iVar2;
  void *pvVar3;
  char *name_00;
  char *name_01;
  char *string;
  expression_t *expression_00;
  expression_base_value_f function_00;
  parser_error local_4c;
  parser_error result;
  char *expr;
  char *base;
  char *name;
  expression_base_value_f function;
  expression_t *expression;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x20a,"enum parser_error parse_player_timed_effect_expr(struct parser *)");
  }
  if ((*(long *)((long)pvVar3 + 8) == 0) || (*(long *)(*(long *)((long)pvVar3 + 8) + 0x10) == 0)) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name_00 = parser_getsym(p,"name");
    name_01 = parser_getsym(p,"base");
    string = parser_getstr(p,"expr");
    expression_00 = expression_new();
    if (expression_00 == (expression_t *)0x0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_EXPRESSION;
    }
    else {
      function_00 = effect_value_base_by_name(name_01);
      expression_set_base_value(expression_00,function_00);
      iVar1 = expression_add_operations_string(expression_00,string);
      if (iVar1 < 0) {
        local_4c = PARSE_ERROR_BAD_EXPRESSION_STRING;
      }
      else {
        iVar2 = dice_bind_expression
                          (*(dice_t **)(*(long *)((long)pvVar3 + 8) + 0x10),name_00,expression_00);
        if (iVar2 < 0) {
          local_4c = PARSE_ERROR_UNBOUND_EXPRESSION;
        }
        else {
          local_4c = PARSE_ERROR_NONE;
        }
      }
      expression_free(expression_00);
      p_local._4_4_ = local_4c;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_player_timed_effect_expr(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	expression_t *expression;
	expression_base_value_f function;
	const char *name, *base, *expr;
	enum parser_error result;

	assert(ps);
	if (!ps->e || !ps->e->dice) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getsym(p, "name");
	base = parser_getsym(p, "base");
	expr = parser_getstr(p, "expr");
	expression = expression_new();
	if (expression == NULL) {
		return PARSE_ERROR_INVALID_EXPRESSION;
	}
	function = effect_value_base_by_name(base);
	expression_set_base_value(expression, function);
	if (expression_add_operations_string(expression, expr) < 0) {
		result = PARSE_ERROR_BAD_EXPRESSION_STRING;
	} else if (dice_bind_expression(ps->e->dice, name, expression) < 0) {
		result = PARSE_ERROR_UNBOUND_EXPRESSION;
	} else {
		result = PARSE_ERROR_NONE;
	}
	/*
	 * The dice object makes a deep copy of the expression, so we can
	 * free it.
	 */
	expression_free(expression);
	return result;
}